

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_read.c
# Opt level: O3

char * parse_name(char *line)

{
  char *pcVar1;
  
  pcVar1 = strtok(line," \t\n");
  if ((*pcVar1 == '@') || (*pcVar1 == '>')) {
    pcVar1 = pcVar1 + 1;
  }
  return pcVar1;
}

Assistant:

char *parse_name(char *line)
{
	char *word;
	char *delims = " \t\n"; /* space, tab, newline */
	word = strtok(line, delims);
	/* check if the name begins with '>' or '@' and drop it */
	if ( *word == '>' || *word == '@' )
		word++; /* move the word up one char */
	return word;
}